

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Flate.cc
# Opt level: O2

void __thiscall
Pl_Flate::Pl_Flate(Pl_Flate *this,char *identifier,Pipeline *next,action_e action,
                  uint out_bufsize_int)

{
  logic_error *this_00;
  action_e action_local;
  ulong local_30;
  
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_Flate_002ac500;
  local_30 = (ulong)out_bufsize_int;
  std::make_unique<Pl_Flate::Members,unsigned_long,Pl_Flate::action_e&>
            ((unsigned_long *)&this->m,(action_e *)&local_30);
  if (next != (Pipeline *)0x0) {
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"Attempt to create Pl_Flate with nullptr as next");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

Pl_Flate::Pl_Flate(
    char const* identifier, Pipeline* next, action_e action, unsigned int out_bufsize_int) :
    Pipeline(identifier, next),
    m(std::make_unique<Members>(QIntC::to_size(out_bufsize_int), action))
{
    if (!next) {
        throw std::logic_error("Attempt to create Pl_Flate with nullptr as next");
    }
}